

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O0

void Acec_PrintSignature(Vec_Wec_t *vMonos)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p;
  int local_20;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Wec_t *vMonos_local;
  
  uVar2 = Vec_WecSize(vMonos);
  printf("Output signature with %d monomials:\n",(ulong)uVar2);
  for (Entry = 0; iVar3 = Vec_WecSize(vMonos), Entry < iVar3; Entry = Entry + 1) {
    p = Vec_WecEntry(vMonos,Entry);
    iVar3 = Vec_IntEntryLast(p);
    pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
    if (0 < iVar3) {
      pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
    }
    iVar3 = Vec_IntEntryLast(p);
    iVar3 = Abc_AbsInt(iVar3);
    printf("  %s2^%d",pcVar1 + 0x4a,(ulong)(iVar3 - 1));
    for (local_20 = 0; iVar3 = Vec_IntSize(p), local_20 < iVar3 + -1; local_20 = local_20 + 1) {
      uVar2 = Vec_IntEntry(p,local_20);
      printf(" * ");
      if ((int)uVar2 < 0) {
        printf("i%d",(ulong)(0xffffffff - uVar2));
      }
      else {
        printf("o%d",(ulong)uVar2);
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Acec_PrintSignature( Vec_Wec_t * vMonos )
{
    Vec_Int_t * vLevel; int i, k, Entry;
    printf( "Output signature with %d monomials:\n", Vec_WecSize(vMonos) );
    Vec_WecForEachLevel( vMonos, vLevel, i )
    {
        printf( "  %s2^%d", Vec_IntEntryLast(vLevel) > 0 ? "+":"-", Abc_AbsInt(Vec_IntEntryLast(vLevel))-1 );
        Vec_IntForEachEntryStop( vLevel, Entry, k, Vec_IntSize(vLevel)-1 )
        {
            printf( " * " );
            if ( Entry < 0 )
                printf( "i%d", -Entry-1 );
            else 
                printf( "o%d", Entry );
        }
        printf( "\n" );
    }
}